

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::CloseButton(ImGuiID id,ImVec2 *pos)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  bool bVar6;
  ImU32 IVar7;
  float fVar8;
  float fVar9;
  bool held;
  bool hovered;
  ImVec2 center;
  bool local_7a;
  bool local_79;
  ImVec2 local_78;
  ImRect local_70;
  float local_60;
  float local_5c;
  undefined1 local_58 [16];
  ImVec2 local_48;
  ImVec2 local_40;
  undefined1 local_38 [16];
  
  pIVar4 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  fVar8 = pos->x;
  fVar9 = pos->y;
  fVar1 = (GImGui->Style).FramePadding.x;
  fVar2 = (GImGui->Style).FramePadding.y;
  local_60 = fVar1 + fVar1 + GImGui->FontSize + fVar8;
  local_5c = fVar2 + fVar2 + GImGui->FontSize + fVar9;
  local_70.Min.x = fVar8;
  local_70.Min.y = fVar9;
  local_70.Max.x = local_60;
  local_70.Max.y = local_5c;
  if ((((pIVar3->OuterRectClipped).Max.y - (pIVar3->OuterRectClipped).Min.y) *
      ((pIVar3->OuterRectClipped).Max.x - (pIVar3->OuterRectClipped).Min.x)) /
      ((local_5c - fVar9) * (local_60 - fVar8)) < 1.5) {
    local_70.Max.x = (float)(int)((local_60 - fVar8) * -0.25);
    local_70.Max.y = (float)(int)((local_5c - fVar9) * -0.25);
    local_70.Min.x = fVar8 - local_70.Max.x;
    local_70.Min.y = fVar9 - local_70.Max.y;
    local_70.Max.x = local_60 + local_70.Max.x;
    local_70.Max.y = local_5c + local_70.Max.y;
  }
  local_38 = ZEXT416((uint)fVar9);
  local_58 = ZEXT416((uint)fVar8);
  bVar5 = ItemAdd(&local_70,id,(ImRect *)0x0,0);
  bVar6 = ButtonBehavior(&local_70,id,&local_79,&local_7a,0);
  if (bVar5) {
    IVar7 = GetColorU32(local_7a | 0x16,1.0);
    local_78.x = ((float)local_58._0_4_ + local_60) * 0.5;
    local_78.y = ((float)local_38._0_4_ + local_5c) * 0.5;
    if (local_79 == true) {
      fVar9 = pIVar4->FontSize * 0.5 + 1.0;
      fVar8 = 2.0;
      if (2.0 <= fVar9) {
        fVar8 = fVar9;
      }
      ImDrawList::AddCircleFilled(pIVar3->DrawList,&local_78,fVar8,IVar7,0xc);
    }
    local_58 = ZEXT416((uint)(pIVar4->FontSize * 0.5 * 0.7071 + -1.0));
    IVar7 = GetColorU32(0,1.0);
    local_78.x = local_78.x + -0.5;
    local_78.y = local_78.y + -0.5;
    local_40.y = (float)local_58._0_4_ + local_78.y;
    local_40.x = (float)local_58._0_4_ + local_78.x;
    local_48.y = local_78.y - (float)local_58._0_4_;
    local_48.x = local_78.x - (float)local_58._0_4_;
    ImDrawList::AddLine(pIVar3->DrawList,&local_40,&local_48,IVar7,1.0);
    local_40.y = local_78.y - (float)local_58._0_4_;
    local_40.x = (float)local_58._0_4_ + local_78.x;
    local_48.y = (float)local_58._0_4_ + local_78.y;
    local_48.x = local_78.x - (float)local_58._0_4_;
    ImDrawList::AddLine(pIVar3->DrawList,&local_40,&local_48,IVar7,1.0);
  }
  return bVar6;
}

Assistant:

bool ImGui::CloseButton(ImGuiID id, const ImVec2& pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Tweak 1: Shrink hit-testing area if button covers an abnormally large proportion of the visible region. That's in order to facilitate moving the window away. (#3825)
    // This may better be applied as a general hit-rect reduction mechanism for all widgets to ensure the area to move window is always accessible?
    const ImRect bb(pos, pos + ImVec2(g.FontSize, g.FontSize) + g.Style.FramePadding * 2.0f);
    ImRect bb_interact = bb;
    const float area_to_visible_ratio = window->OuterRectClipped.GetArea() / bb.GetArea();
    if (area_to_visible_ratio < 1.5f)
        bb_interact.Expand(ImFloor(bb_interact.GetSize() * -0.25f));

    // Tweak 2: We intentionally allow interaction when clipped so that a mechanical Alt,Right,Activate sequence can always close a window.
    // (this isn't the regular behavior of buttons, but it doesn't affect the user much because navigation tends to keep items visible).
    bool is_clipped = !ItemAdd(bb_interact, id);

    bool hovered, held;
    bool pressed = ButtonBehavior(bb_interact, id, &hovered, &held);
    if (is_clipped)
        return pressed;

    // Render
    // FIXME: Clarify this mess
    ImU32 col = GetColorU32(held ? ImGuiCol_ButtonActive : ImGuiCol_ButtonHovered);
    ImVec2 center = bb.GetCenter();
    if (hovered)
        window->DrawList->AddCircleFilled(center, ImMax(2.0f, g.FontSize * 0.5f + 1.0f), col, 12);

    float cross_extent = g.FontSize * 0.5f * 0.7071f - 1.0f;
    ImU32 cross_col = GetColorU32(ImGuiCol_Text);
    center -= ImVec2(0.5f, 0.5f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent, +cross_extent), center + ImVec2(-cross_extent, -cross_extent), cross_col, 1.0f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent, -cross_extent), center + ImVec2(-cross_extent, +cross_extent), cross_col, 1.0f);

    return pressed;
}